

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O0

void setIC(N_Vector yy,N_Vector yp,UserData data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar4;
  double __x;
  double dVar5;
  sunrealtype Q [3];
  sunrealtype x;
  sunrealtype p;
  sunrealtype q;
  sunrealtype J2;
  sunrealtype m2;
  sunrealtype J1;
  sunrealtype a;
  sunrealtype pi;
  double local_78;
  double local_70;
  double local_68;
  
  N_VConst(in_RDI);
  N_VConst(in_RSI);
  dVar4 = atan(1.0);
  dVar1 = in_RDX[1];
  dVar2 = in_RDX[3];
  dVar3 = in_RDX[2];
  __x = asin(-*in_RDX);
  dVar5 = cos(__x);
  **(double **)(*in_RDI + 0x10) = (dVar4 * 4.0) / 2.0;
  *(double *)(*(long *)(*in_RDI + 0x10) + 8) = dVar5;
  *(double *)(*(long *)(*in_RDI + 0x10) + 0x10) = __x;
  force((N_Vector)m2,(sunrealtype *)J2,(UserData)q);
  *(double *)(*(long *)(*in_RSI + 0x10) + 0x18) = local_78 / dVar1;
  *(double *)(*(long *)(*in_RSI + 0x10) + 0x20) = local_70 / dVar2;
  *(double *)(*(long *)(*in_RSI + 0x10) + 0x28) = local_68 / dVar3;
  return;
}

Assistant:

void setIC(N_Vector yy, N_Vector yp, UserData data)
{
  sunrealtype pi;
  sunrealtype a, J1, m2, J2;
  sunrealtype q, p, x;
  sunrealtype Q[3];

  N_VConst(ZERO, yy);
  N_VConst(ZERO, yp);

  pi = FOUR * atan(ONE);

  a  = data->a;
  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  q = pi / TWO;
  p = asin(-a);
  x = cos(p);

  NV_Ith_S(yy, 0) = q;
  NV_Ith_S(yy, 1) = x;
  NV_Ith_S(yy, 2) = p;

  force(yy, Q, data);

  NV_Ith_S(yp, 3) = Q[0] / J1;
  NV_Ith_S(yp, 4) = Q[1] / m2;
  NV_Ith_S(yp, 5) = Q[2] / J2;
}